

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int archive_read_format_iso9660_bid(archive_read *a,int best_bid)

{
  vd *pvVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  iso9660 *iso9660;
  long lVar5;
  char cVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  uint32_t uVar10;
  void *pvVar11;
  vd *pvVar12;
  uint32_t *puVar13;
  uint64_t uVar14;
  long lVar15;
  byte *h;
  ssize_t bytes_read;
  ulong local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  iVar7 = -1;
  if (best_bid < 0x31) {
    iso9660 = (iso9660 *)a->format->data;
    pvVar11 = __archive_read_ahead(a,0xc000,&bytes_read);
    if (pvVar11 != (void *)0x0) {
      h = (byte *)((long)pvVar11 + 0x8000);
      pvVar1 = &iso9660->primary;
      local_40 = &(iso9660->primary).size;
      local_38 = &(iso9660->joliet).size;
      lVar5 = bytes_read + -0x8800;
      bytes_read = bytes_read + -0x8000;
      while (lVar15 = lVar5, 0x800 < lVar15 + 0x800) {
        bVar2 = *h;
        if ((3 < bVar2) && (bVar2 != 0xff)) {
          return 0;
        }
        iVar7 = bcmp(h + 1,"CD001",5);
        if (iVar7 != 0) {
          return 0;
        }
        if (((((bVar2 == 1) && (h[6] == 1)) && (h[7] == 0)) &&
            ((iVar7 = isNull(iso9660,h,0x48,8), iVar7 != 0 &&
             (iVar7 = isNull(iso9660,h,0x58,0x20), iVar7 != 0)))) &&
           ((ulong)*(ushort *)(h + 0x80) != 0)) {
          iVar7 = *(int *)(h + 0x50);
          if (((((long)iVar7 < 0x15) || (h[0x371] != 1)) ||
              ((iVar7 <= *(int *)(h + 0x8c) || *(int *)(h + 0x8c) < 0x12 ||
               (((local_48 = (ulong)*(ushort *)(h + 0x80), uVar10 = archive_be32dec(h + 0x94),
                 iVar7 <= (int)uVar10 || 0xffffffee < uVar10 - 0x12 || ((h[0x372] & 0xdf) != 0)) ||
                (iVar9 = isNull(iso9660,h,0x573,0x28d), iVar9 == 0)))))) || (h[0x9c] != 0x22))
          goto LAB_0016a35d;
          if (pvVar1->location != 0) goto LAB_0016a428;
          iso9660->logical_block_size = local_48;
          iso9660->volume_block = iVar7;
          uVar14 = (long)iVar7 * local_48;
          pvVar12 = pvVar1;
          puVar13 = local_40;
LAB_0016a683:
          iso9660->volume_size = uVar14;
          pvVar12->location = *(int *)(h + 0x9e);
          *puVar13 = *(uint32_t *)(h + 0xa6);
        }
        else {
LAB_0016a35d:
          if ((((iso9660->joliet).location == 0) && (iVar7 = isSVD(iso9660,h), iVar7 != 0)) &&
             ((h[0x58] == 0x25 && (h[0x59] == 0x2f)))) {
            bVar3 = h[0x5a];
            if (bVar3 == 0x40) {
              cVar6 = '\x01';
            }
            else if (bVar3 == 0x45) {
              cVar6 = '\x03';
            }
            else {
              if (bVar3 != 0x43) goto LAB_0016a363;
              cVar6 = '\x02';
            }
            iso9660->seenJoliet = cVar6;
            uVar4 = *(ushort *)(h + 0x80);
            iVar7 = *(int *)(h + 0x50);
            iso9660->logical_block_size = (ulong)uVar4;
            iso9660->volume_block = iVar7;
            uVar14 = (long)iVar7 * (ulong)uVar4;
            pvVar12 = &iso9660->joliet;
            puVar13 = local_38;
            goto LAB_0016a683;
          }
LAB_0016a363:
          if (bVar2 == 2) {
            if (((((h[6] != 2) || (h[7] != 0)) ||
                 ((iVar7 = isNull(iso9660,h,0x48,8), iVar7 == 0 ||
                  (((iVar7 = isNull(iso9660,h,0x58,0x20), iVar7 == 0 || (*(short *)(h + 0x80) == 0))
                   || (iVar7 = *(int *)(h + 0x50), iVar7 < 0x15)))))) ||
                ((h[0x371] != 2 || (iVar7 <= *(int *)(h + 0x8c) || *(int *)(h + 0x8c) < 0x12)))) ||
               ((uVar10 = archive_be32dec(h + 0x94),
                iVar7 <= (int)uVar10 || 0xffffffee < uVar10 - 0x12 ||
                (((iVar7 = isNull(iso9660,h,0x372,1), iVar7 == 0 ||
                  (iVar7 = isNull(iso9660,h,0x573,0x28d), iVar7 == 0)) || (h[0x9c] != 0x22))))))
            goto LAB_0016a3cc;
          }
          else if ((bVar2 != 0) || (h[6] != 1)) {
LAB_0016a3cc:
            iVar7 = isSVD(iso9660,h);
            if (iVar7 == 0) {
              if (bVar2 != 3) {
                if (bVar2 != 0xff) {
                  return 0;
                }
                if (h[6] != 1) {
                  return 0;
                }
                iVar7 = isNull(iso9660,h,7,0x7f9);
                if (iVar7 == 0) {
                  return 0;
                }
                if (0x10 < pvVar1->location) {
                  return 0x30;
                }
                break;
              }
              if (h[6] != 1) {
                return 0;
              }
              if (h[7] != 0) {
                return 0;
              }
              uVar10 = *(uint32_t *)(h + 0x48);
              if ((int)uVar10 < 0x11) {
                return 0;
              }
              if (iso9660->volume_block <= (int)uVar10) {
                return 0;
              }
              uVar8 = archive_be32dec(h + 0x4c);
              if (uVar10 != uVar8) {
                return 0;
              }
            }
          }
        }
LAB_0016a428:
        h = h + 0x800;
        bytes_read = lVar15;
        lVar5 = lVar15 + -0x800;
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

static int
archive_read_format_iso9660_bid(struct archive_read *a, int best_bid)
{
	struct iso9660 *iso9660;
	ssize_t bytes_read;
	const unsigned char *p;
	int seenTerminator;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 48)
		return (-1);

	iso9660 = (struct iso9660 *)(a->format->data);

	/*
	 * Skip the first 32k (reserved area) and get the first
	 * 8 sectors of the volume descriptor table.  Of course,
	 * if the I/O layer gives us more, we'll take it.
	 */
#define RESERVED_AREA	(SYSTEM_AREA_BLOCK * LOGICAL_BLOCK_SIZE)
	p = __archive_read_ahead(a,
	    RESERVED_AREA + 8 * LOGICAL_BLOCK_SIZE,
	    &bytes_read);
	if (p == NULL)
	    return (-1);

	/* Skip the reserved area. */
	bytes_read -= RESERVED_AREA;
	p += RESERVED_AREA;

	/* Check each volume descriptor. */
	seenTerminator = 0;
	for (; bytes_read > LOGICAL_BLOCK_SIZE;
	    bytes_read -= LOGICAL_BLOCK_SIZE, p += LOGICAL_BLOCK_SIZE) {
		/* Do not handle undefined Volume Descriptor Type. */
		if (p[0] >= 4 && p[0] <= 254)
			return (0);
		/* Standard Identifier must be "CD001" */
		if (memcmp(p + 1, "CD001", 5) != 0)
			return (0);
		if (isPVD(iso9660, p))
			continue;
		if (!iso9660->joliet.location) {
			if (isJolietSVD(iso9660, p))
				continue;
		}
		if (isBootRecord(iso9660, p))
			continue;
		if (isEVD(iso9660, p))
			continue;
		if (isSVD(iso9660, p))
			continue;
		if (isVolumePartition(iso9660, p))
			continue;
		if (isVDSetTerminator(iso9660, p)) {
			seenTerminator = 1;
			break;
		}
		return (0);
	}
	/*
	 * ISO 9660 format must have Primary Volume Descriptor and
	 * Volume Descriptor Set Terminator.
	 */
	if (seenTerminator && iso9660->primary.location > 16)
		return (48);

	/* We didn't find a valid PVD; return a bid of zero. */
	return (0);
}